

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O2

bool __thiscall
cubeb_client::register_device_collection_changed(cubeb_client *this,cubeb_device_type devtype)

{
  int iVar1;
  code *callback;
  
  if (devtype == (CUBEB_DEVICE_TYPE_OUTPUT|CUBEB_DEVICE_TYPE_INPUT)) {
    callback = io_device_changed_callback_s;
  }
  else if ((devtype & CUBEB_DEVICE_TYPE_OUTPUT) == CUBEB_DEVICE_TYPE_UNKNOWN) {
    callback = (cubeb_device_collection_changed_callback)0x0;
    if ((devtype & CUBEB_DEVICE_TYPE_INPUT) != CUBEB_DEVICE_TYPE_UNKNOWN) {
      callback = input_device_changed_callback_s;
    }
  }
  else {
    callback = output_device_changed_callback_s;
  }
  iVar1 = cubeb_register_device_collection_changed(this->context,devtype,callback,(void *)0x0);
  return iVar1 == 0;
}

Assistant:

bool cubeb_client::register_device_collection_changed(
    cubeb_device_type devtype) const {
  cubeb_device_collection_changed_callback callback = nullptr;
  if (devtype == static_cast<cubeb_device_type>(CUBEB_DEVICE_TYPE_INPUT |
                                                CUBEB_DEVICE_TYPE_OUTPUT)) {
    callback = io_device_changed_callback_s;
  } else if (devtype & CUBEB_DEVICE_TYPE_OUTPUT) {
    callback = output_device_changed_callback_s;
  } else if (devtype & CUBEB_DEVICE_TYPE_INPUT) {
    callback = input_device_changed_callback_s;
  }
  int r = cubeb_register_device_collection_changed(
            context, devtype, callback, nullptr);
  if (r != CUBEB_OK) {
    return false;
  }
  return true;
}